

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall soplex::SSVectorBase<double>::reDim(SSVectorBase<double> *this,int newdim)

{
  uint uVar1;
  char *pcVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  int in_ESI;
  SSVectorBase<double> *in_RDI;
  int i;
  bool in_stack_0000001b;
  int in_stack_0000001c;
  VectorBase<double> *in_stack_00000020;
  int newmax;
  
  uVar1 = IdxSet::size(&in_RDI->super_IdxSet);
  uVar3 = extraout_RDX;
  while (uVar1 = uVar1 - 1, -1 < (int)uVar1) {
    pcVar2 = index(in_RDI,(char *)(ulong)uVar1,(int)uVar3);
    uVar3 = extraout_RDX_00;
    if (in_ESI <= (int)pcVar2) {
      IdxSet::remove(&in_RDI->super_IdxSet,(char *)(ulong)uVar1);
      uVar3 = extraout_RDX_01;
    }
  }
  VectorBase<double>::reDim(in_stack_00000020,in_stack_0000001c,in_stack_0000001b);
  newmax = (int)((ulong)in_RDI >> 0x20);
  VectorBase<double>::memSize((VectorBase<double> *)0x281a5b);
  setMax((SSVectorBase<double> *)CONCAT44(in_ESI,uVar1),newmax);
  return;
}

Assistant:

void reDim(int newdim)
   {
      for(int i = IdxSet::size() - 1; i >= 0; --i)
      {
         if(index(i) >= newdim)
            remove(i);
      }

      VectorBase<R>::reDim(newdim);
      setMax(VectorBase<R>::memSize() + 1);

      assert(isConsistent());
   }